

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

void __thiscall QStyle::QStyle(QStyle *this)

{
  QStylePrivate *pQVar1;
  QObject *in_RDI;
  QStylePrivate *d;
  
  pQVar1 = (QStylePrivate *)operator_new(0x98);
  QStylePrivate::QStylePrivate(pQVar1);
  QObject::QObject(in_RDI,&pQVar1->super_QObjectPrivate,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0a740;
  pQVar1 = d_func((QStyle *)0x409db9);
  pQVar1->proxyStyle = (QStyle *)in_RDI;
  return;
}

Assistant:

QStyle::QStyle()
    : QObject(*new QStylePrivate)
{
    Q_D(QStyle);
    d->proxyStyle = this;
}